

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.h
# Opt level: O1

void __thiscall HEkkDual::~HEkkDual(HEkkDual *this)

{
  void *pvVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pcVar4;
  long lVar5;
  
  lVar5 = 0;
  do {
    pvVar1 = *(void **)((long)&this->multi_finish[7].flipList.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar5);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar5 = lVar5 + -0x78;
  } while (lVar5 != -0x3c0);
  lVar5 = 0x24d0;
  do {
    MChoice::~MChoice((MChoice *)((long)&this->algorithm + lVar5));
    lVar5 = lVar5 + -0x248;
  } while (lVar5 != 0x1290);
  std::vector<HEkkDualRow,_std::allocator<HEkkDualRow>_>::~vector(&this->slice_dualRow);
  lVar5 = 0;
  do {
    pvVar1 = *(void **)((long)this->multi_choice + lVar5 + -0x48);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    pvVar1 = *(void **)((long)this->multi_choice + lVar5 + -0x60);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    pvVar1 = *(void **)((long)&this->slice_row_ap[7].iwork.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar5);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    pvVar1 = *(void **)((long)&this->slice_row_ap[7].cwork.
                               super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar5);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    pvVar1 = *(void **)((long)&this->slice_row_ap[7].array.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar5);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    pvVar1 = *(void **)((long)&this->slice_row_ap[7].index.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar5);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar5 = lVar5 + -0xb0;
  } while (lVar5 != -0x580);
  lVar5 = 0;
  do {
    pvVar1 = *(void **)((long)this->slice_row_ap + lVar5 + -0x18);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    pvVar1 = *(void **)((long)this->slice_row_ap + lVar5 + -0x30);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    pvVar1 = *(void **)((long)this->slice_row_ap + lVar5 + -0x48);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    pvVar1 = *(void **)((long)this->slice_row_ap + lVar5 + -0x60);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar5 = lVar5 + -0x70;
  } while (lVar5 != -0x380);
  lVar5 = 0;
  do {
    pvVar1 = *(void **)((long)this->slice_ar_matrix + lVar5 + -0x18);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    pvVar1 = *(void **)((long)this->slice_ar_matrix + lVar5 + -0x30);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    pvVar1 = *(void **)((long)this->slice_ar_matrix + lVar5 + -0x48);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    pvVar1 = *(void **)((long)this->slice_ar_matrix + lVar5 + -0x60);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar5 = lVar5 + -0x70;
  } while (lVar5 != -0x380);
  piVar2 = (this->dualRHS).workPartition.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  pdVar3 = (this->dualRHS).work_infeasibility.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  piVar2 = (this->dualRHS).workIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  pcVar4 = (this->dualRHS).workMark.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar4 != (pointer)0x0) {
    operator_delete(pcVar4);
  }
  HEkkDualRow::~HEkkDualRow(&this->dualRow);
  pdVar3 = (this->dev_col_DSE).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  piVar2 = (this->dev_col_DSE).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  piVar2 = (this->dev_col_DSE).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  pcVar4 = (this->dev_col_DSE).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar4 != (pointer)0x0) {
    operator_delete(pcVar4);
  }
  pdVar3 = (this->dev_col_DSE).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  piVar2 = (this->dev_col_DSE).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  pdVar3 = (this->dev_row_ep).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  piVar2 = (this->dev_row_ep).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  piVar2 = (this->dev_row_ep).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  pcVar4 = (this->dev_row_ep).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar4 != (pointer)0x0) {
    operator_delete(pcVar4);
  }
  pdVar3 = (this->dev_row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  piVar2 = (this->dev_row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  pdVar3 = (this->col_DSE).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  piVar2 = (this->col_DSE).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  piVar2 = (this->col_DSE).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  pcVar4 = (this->col_DSE).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar4 != (pointer)0x0) {
    operator_delete(pcVar4);
  }
  pdVar3 = (this->col_DSE).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  piVar2 = (this->col_DSE).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  pdVar3 = (this->col_BFRT).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  piVar2 = (this->col_BFRT).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  piVar2 = (this->col_BFRT).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  pcVar4 = (this->col_BFRT).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar4 != (pointer)0x0) {
    operator_delete(pcVar4);
  }
  pdVar3 = (this->col_BFRT).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  piVar2 = (this->col_BFRT).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  pdVar3 = (this->col_aq).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  piVar2 = (this->col_aq).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  piVar2 = (this->col_aq).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  pcVar4 = (this->col_aq).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar4 != (pointer)0x0) {
    operator_delete(pcVar4);
  }
  pdVar3 = (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  piVar2 = (this->col_aq).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  pdVar3 = (this->row_ap).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  piVar2 = (this->row_ap).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  piVar2 = (this->row_ap).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  pcVar4 = (this->row_ap).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar4 != (pointer)0x0) {
    operator_delete(pcVar4);
  }
  pdVar3 = (this->row_ap).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  piVar2 = (this->row_ap).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  pdVar3 = (this->row_ep).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  piVar2 = (this->row_ep).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  piVar2 = (this->row_ep).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  pcVar4 = (this->row_ep).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar4 != (pointer)0x0) {
    operator_delete(pcVar4);
  }
  pdVar3 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  piVar2 = (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
    return;
  }
  return;
}

Assistant:

HEkkDual(HEkk& simplex)
      : ekk_instance_(simplex), dualRow(simplex), dualRHS(simplex) {
    initialiseInstance();
    dualRow.setup();
    dualRHS.setup();
    if (!(ekk_instance_.info_.simplex_strategy == kSimplexStrategyDualPlain))
      initialiseInstanceParallel(simplex);
  }